

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Buffer __thiscall nvim::Nvim::create_buf(Nvim *this,bool listed,bool scratch)

{
  allocator local_41;
  string local_40;
  Buffer local_20;
  Buffer res;
  bool scratch_local;
  Nvim *pNStack_10;
  bool listed_local;
  Nvim *this_local;
  
  res._6_1_ = scratch;
  res._7_1_ = listed;
  pNStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_create_buf",&local_41);
  NvimRPC::call<bool,bool>
            (&this->client_,&local_40,&local_20,(bool *)((long)&res + 7),(bool *)((long)&res + 6));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return local_20;
}

Assistant:

Buffer Nvim::create_buf(bool listed, bool scratch) {
    Buffer res;
    client_.call("nvim_create_buf", res, listed, scratch);
    return res;
}